

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correctness.cc
# Opt level: O1

void __thiscall CorrectnessTest::start_test(CorrectnessTest *this,void *args)

{
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"KVStore Correctness Test",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[Simple Test]",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  regular_test(this,this->SIMPLE_TEST_MAX);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[Large Test]",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  regular_test(this,this->LARGE_TEST_MAX);
  return;
}

Assistant:

void start_test(void *args = NULL) override {
    std::cout << "KVStore Correctness Test" << std::endl;

    std::cout << "[Simple Test]" << std::endl;
    regular_test(SIMPLE_TEST_MAX);

    std::cout << "[Large Test]" << std::endl;
    regular_test(LARGE_TEST_MAX);
  }